

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  ImVector<ImDrawChannel> *this_00;
  int iVar1;
  ImDrawChannel *pIVar2;
  int i;
  int i_00;
  
  if ((this->_Current == 0) && (this->_Count < 2)) {
    this_00 = &this->_Channels;
    iVar1 = (this->_Channels).Size;
    if (iVar1 < channels_count) {
      ImVector<ImDrawChannel>::reserve(this_00,channels_count);
      ImVector<ImDrawChannel>::resize(this_00,channels_count);
    }
    this->_Count = channels_count;
    pIVar2 = ImVector<ImDrawChannel>::operator[](this_00,0);
    (pIVar2->_CmdBuffer).Size = 0;
    (pIVar2->_CmdBuffer).Capacity = 0;
    (pIVar2->_CmdBuffer).Data = (ImDrawCmd *)0x0;
    (pIVar2->_IdxBuffer).Size = 0;
    (pIVar2->_IdxBuffer).Capacity = 0;
    (pIVar2->_IdxBuffer).Data = (unsigned_short *)0x0;
    for (i_00 = 1; i_00 < channels_count; i_00 = i_00 + 1) {
      pIVar2 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
      if (i_00 < iVar1) {
        ImVector<ImDrawCmd>::resize(&pIVar2->_CmdBuffer,0);
        pIVar2 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
        ImVector<unsigned_short>::resize(&pIVar2->_IdxBuffer,0);
      }
      else {
        (pIVar2->_IdxBuffer).Size = 0;
        (pIVar2->_IdxBuffer).Capacity = 0;
        (pIVar2->_IdxBuffer).Data = (unsigned_short *)0x0;
        (pIVar2->_CmdBuffer).Size = 0;
        (pIVar2->_CmdBuffer).Capacity = 0;
        (pIVar2->_CmdBuffer).Data = (ImDrawCmd *)0x0;
      }
    }
    return;
  }
  __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_draw.cpp"
                ,0x6a4,"void ImDrawListSplitter::Split(ImDrawList *, int)");
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_UNUSED(draw_list);
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
    {
        _Channels.reserve(channels_count); // Avoid over reserving since this is likely to stay stable
        _Channels.resize(channels_count);
    }
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
    }
}